

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iteratedhash.hpp
# Opt level: O2

size_t crypto::iterated_hash<crypto::sha256_transform>::hash
                 (hash_word *state,char *input,size_t length)

{
  hash_word aligned_buffer [16];
  
  do {
    util::endianness<util::big_endian>::load<unsigned_int>(input,aligned_buffer,0x10);
    sha256_transform::transform(state,aligned_buffer);
    input = input + 0x40;
    length = length - 0x40;
  } while (0x3f < length);
  return length;
}

Assistant:

size_t iterated_hash<T>::hash(hash_word state[hash_size], const char * input, size_t length) {
	
	if(byte_order::native() && util::is_aligned<hash_word>(input)) {
		
		do {
			
			transform::transform(state, reinterpret_cast<const hash_word *>(input));
			
			input += block_size;
			length -= block_size;
			
		} while(length >= block_size);
		
	} else {
		
		do {
			
			hash_word aligned_buffer[block_size / sizeof(hash_word)];
			byte_order::load(input, aligned_buffer, size_t(boost::size(aligned_buffer)));
			
			transform::transform(state, aligned_buffer);
			
			input += block_size;
			length -= block_size;
			
		} while(length >= block_size);
		
	}
	
	return length;
}